

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O0

bignum_t<10> __thiscall bignum_t<10>::operator/(bignum_t<10> *this,long l)

{
  bignum_t<10> *in_RDI;
  bignum_t<10> bVar1;
  bignum_t<10> bl;
  long in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffba;
  bignum_t<10> *in_stack_ffffffffffffffc0;
  
  bignum_t(in_RDI,in_stack_ffffffffffffff98);
  bVar1 = operator/(in_stack_ffffffffffffffc0,
                    (bignum_t<10> *)CONCAT62(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8));
  return (bignum_t<10>)bVar1.ext;
}

Assistant:

bignum_t operator /(long l) const
    {
        bignum_t<prec> bl(l);
        return *this / bl;
    }